

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NurbsCurveGeometry.h
# Opt level: O2

vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
* __thiscall
anurbs::NurbsCurveGeometry<2L>::derivatives_at
          (vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
           *__return_storage_ptr__,NurbsCurveGeometry<2L> *this,double t,Index order)

{
  DenseStorage<double,_2,_1,_2,_1> DVar1;
  Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *pRVar2;
  Scalar *scalar;
  Index i;
  long col;
  Index order_1;
  long row;
  vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
  *derivatives;
  NurbsCurveShapeFunction shape_function;
  Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> local_170;
  Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> local_148;
  Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> local_120;
  type local_f8;
  undefined1 local_d0 [16];
  double *local_c0;
  Index IStack_b8;
  Index local_b0;
  double *pdStack_a8;
  Index local_a0;
  double *pdStack_98;
  Index local_90;
  double *pdStack_88;
  Index local_80;
  Index IStack_78;
  double *local_70;
  Index IStack_68;
  double *local_60;
  Index IStack_58;
  
  local_60 = (double *)0x0;
  IStack_58 = 0;
  local_70 = (double *)0x0;
  IStack_68 = 0;
  local_80 = 0;
  IStack_78 = 0;
  local_90 = 0;
  pdStack_88 = (double *)0x0;
  local_a0 = 0;
  pdStack_98 = (double *)0x0;
  local_b0 = 0;
  pdStack_a8 = (double *)0x0;
  local_c0 = (double *)0x0;
  IStack_b8 = 0;
  NurbsCurveShapeFunction::resize((NurbsCurveShapeFunction *)local_d0,this->m_degree,order);
  if ((this->m_weights).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
      m_rows < 1) {
    Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
    Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_170,
               (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this->m_knots,(type *)0x0);
    NurbsCurveShapeFunction::compute((NurbsCurveShapeFunction *)local_d0,&local_170,t);
    pRVar2 = &local_170;
  }
  else {
    Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
    Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_120,
               (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this->m_knots,(type *)0x0);
    Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
    Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_148,
               (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this->m_weights,(type *)0x0);
    NurbsCurveShapeFunction::compute((NurbsCurveShapeFunction *)local_d0,&local_120,&local_148,t);
    pRVar2 = &local_120;
    free(local_148.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
         .m_data);
  }
  free((pRVar2->m_object).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
       m_data);
  std::
  vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
  ::vector(__return_storage_ptr__,local_d0._8_8_ + 1,(allocator_type *)&local_f8);
  for (row = 0; row <= (long)local_d0._8_8_; row = row + 1) {
    Eigen::DenseBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>::Zero();
    DVar1.m_data.array[1]._0_4_ = local_f8.m_rhs._0_4_;
    DVar1.m_data.array[0] = (double)local_f8.m_rhs._0_8_;
    DVar1.m_data.array[1]._4_4_ = local_f8.m_rhs._4_4_;
    (__return_storage_ptr__->
    super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
    )._M_impl.super__Vector_impl_data._M_start[row].
    super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data =
         DVar1.m_data.array;
    for (col = 0; col <= (long)local_d0._0_8_; col = col + 1) {
      pole((NurbsCurveGeometry<2L> *)&stack0xffffffffffffffb8,(Index)this);
      scalar = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&local_c0,
                          row,col);
      Eigen::MatrixBase<Eigen::Matrix<double,1,2,1,1,2>>::operator*
                (&local_f8,(MatrixBase<Eigen::Matrix<double,1,2,1,1,2>> *)&stack0xffffffffffffffb8,
                 scalar);
      Eigen::MatrixBase<Eigen::Matrix<double,1,2,1,1,2>>::operator+=
                ((MatrixBase<Eigen::Matrix<double,1,2,1,1,2>> *)
                 ((__return_storage_ptr__->
                  super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                  )._M_impl.super__Vector_impl_data._M_start + row),
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
                  *)&local_f8);
    }
  }
  NurbsCurveShapeFunction::~NurbsCurveShapeFunction((NurbsCurveShapeFunction *)local_d0);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Vector> derivatives_at(const double t, const Index order) const override
    {
        NurbsCurveShapeFunction shape_function;

        shape_function.resize(m_degree, order);

        if (m_weights.size() > 0) {
            shape_function.compute(m_knots, m_weights, t);
        } else {
            shape_function.compute(m_knots, t);
        }

        std::vector<Vector> derivatives(shape_function.nb_shapes());

        for (Index order = 0; order < shape_function.nb_shapes(); order++) {
            derivatives[order] = Vector::Zero();

            for (Index i = 0; i < shape_function.nb_nonzero_poles(); i++) {
                Index index = shape_function.first_nonzero_pole() + i;

                derivatives[order] += pole(index) * shape_function.value(order, i);
            }
        }

        return derivatives;
    }